

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbutil.c
# Opt level: O2

armci_hdl_t * get_armci_nbhandle(Integer *nbhandle)

{
  struct_armcihdl_t *nb_handle;
  byte bVar1;
  ga_armcihdl_t *pgVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  struct_armcihdl_t *psVar7;
  int iVar8;
  
  bVar1 = (byte)*nbhandle;
  uVar3 = (long)(lastARMCIhandle + 1) % (long)nb_max_outstanding;
  uVar6 = uVar3 & 0xffffffff;
  lastARMCIhandle = (int)uVar3;
  do {
    iVar5 = (int)uVar6;
    if (lastARMCIhandle + nb_max_outstanding <= iVar5) {
      lVar4 = (long)lastARMCIhandle;
      iVar8 = lastARMCIhandle;
      break;
    }
    iVar8 = iVar5 % nb_max_outstanding;
    lVar4 = (long)iVar8;
    uVar6 = (ulong)(iVar5 + 1);
  } while (armci_ihdl_array[lVar4].active != 0);
  nb_handle = armci_ihdl_array + lVar4;
  if (armci_ihdl_array[lVar4].active != 1) goto LAB_00199e1f;
  iVar5 = armci_ihdl_array[lVar4].ga_hdlarr_index;
  ARMCI_Wait(&nb_handle->handle);
  pgVar2 = armci_ihdl_array[lVar4].next;
  psVar7 = armci_ihdl_array[lVar4].previous;
  if (psVar7 == (struct_armcihdl_t *)0x0) {
    ga_ihdl_array[iVar5].ahandle = pgVar2;
    if (pgVar2 != (ga_armcihdl_t *)0x0) {
      psVar7 = (struct_armcihdl_t *)0x0;
      goto LAB_00199e12;
    }
  }
  else {
    psVar7->next = pgVar2;
    if (pgVar2 != (ga_armcihdl_t *)0x0) {
LAB_00199e12:
      pgVar2->previous = psVar7;
    }
  }
  ga_ihdl_array[iVar5].count = ga_ihdl_array[iVar5].count + -1;
LAB_00199e1f:
  armci_ihdl_array[lVar4].active = 1;
  armci_ihdl_array[lVar4].previous = (struct_armcihdl_t *)0x0;
  pgVar2 = ga_ihdl_array[bVar1].ahandle;
  if (pgVar2 != (ga_armcihdl_t *)0x0) {
    pgVar2->previous = nb_handle;
  }
  ga_ihdl_array[bVar1].ahandle = nb_handle;
  ga_ihdl_array[bVar1].count = ga_ihdl_array[bVar1].count + 1;
  armci_ihdl_array[lVar4].next = pgVar2;
  armci_ihdl_array[lVar4].ga_hdlarr_index = (uint)bVar1;
  lastARMCIhandle = iVar8;
  return &nb_handle->handle;
}

Assistant:

armci_hdl_t* get_armci_nbhandle(Integer *nbhandle)
{
  int i, top, idx, iloc;
  gai_nbhdl_t *inbhandle = (gai_nbhdl_t *)nbhandle;
  int index = inbhandle->ihdl_index;
  ga_armcihdl_t* next = ga_ihdl_array[index].ahandle;

  lastARMCIhandle++;
  lastARMCIhandle = lastARMCIhandle%nb_max_outstanding;
  top = lastARMCIhandle+nb_max_outstanding;
  /* default index if no handles are available */
  iloc = lastARMCIhandle;
  for (i=lastARMCIhandle; i<top; i++) {
    idx = i%nb_max_outstanding;
    if (armci_ihdl_array[idx].active == 0) {
      iloc = idx;
      break;
    }
  }
  /* if selected handle represents an outstanding request, complete it */
  if (armci_ihdl_array[iloc].active == 1) {
    int iga_hdl = armci_ihdl_array[iloc].ga_hdlarr_index;
    ARMCI_Wait(&armci_ihdl_array[iloc].handle);
    /* clean up linked list that this handle used to be a link in */
    if (armci_ihdl_array[iloc].previous != NULL) {
      /* link is not first in linked list */
      armci_ihdl_array[iloc].previous->next = armci_ihdl_array[iloc].next;
      if (armci_ihdl_array[iloc].next != NULL) {
        armci_ihdl_array[iloc].next->previous = armci_ihdl_array[iloc].previous;
      }
    } else {
      /* link is first in linked list. Need to update header */
      ga_ihdl_array[iga_hdl].ahandle = armci_ihdl_array[iloc].next;
      if (armci_ihdl_array[iloc].next != NULL) {
        armci_ihdl_array[iloc].next->previous = NULL;
      }
    }
    ga_ihdl_array[iga_hdl].count--;
  }
  /* Initialize armci handle and add this operation to the linked list
   * corresponding to nbhandle */
  ARMCI_INIT_HANDLE(&armci_ihdl_array[iloc].handle);
  armci_ihdl_array[iloc].active = 1;
  armci_ihdl_array[iloc].previous = NULL;
  if (ga_ihdl_array[index].ahandle) {
    ga_ihdl_array[index].ahandle->previous = &armci_ihdl_array[iloc];
  }
  armci_ihdl_array[iloc].next = ga_ihdl_array[index].ahandle;
  ga_ihdl_array[index].ahandle =  &armci_ihdl_array[iloc];
  armci_ihdl_array[iloc].ga_hdlarr_index = index;
  ga_ihdl_array[index].count++;

  /* reset lastARMCIhandle to iloc */
  lastARMCIhandle = iloc;

  return &armci_ihdl_array[iloc].handle;
}